

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::CleanTestOutput
          (cmCTestTestHandler *this,string *output,size_t length,TruncationMode truncate)

{
  anon_class_1_0_00000001 *begin;
  anon_class_1_0_00000001 *this_00;
  long lVar1;
  char *pcVar2;
  TruncationMode TVar3;
  undefined4 in_register_0000000c;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  string local_68;
  string msg;
  
  this_01 = &bStack_88;
  if (((length != 0) && (length < output->_M_string_length)) &&
     (TVar3 = truncate, lVar1 = std::__cxx11::string::find((char *)output,0x603c1d), lVar1 == -1)) {
    std::__cxx11::to_string(&local_68,length);
    std::operator+(&bStack_88,
                   "\n[This part of the test output was removed since it exceeds the threshold of ",
                   &local_68);
    std::operator+(&msg,&bStack_88," bytes.]\n");
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = (anon_class_1_0_00000001 *)(output->_M_dataplus)._M_p;
    begin = this_00 + output->_M_string_length;
    if (truncate == Middle) {
      pcVar2 = CleanTestOutput::anon_class_1_0_00000001::operator()
                         (this_00,(char *)begin,(char *)(length >> 1),
                          CONCAT44(in_register_0000000c,TVar3));
      std::__cxx11::string::erase((ulong)output,(ulong)(pcVar2 + -(long)this_00));
      std::operator+(&local_68,"...",&msg);
      std::operator+(&bStack_88,&local_68,"...");
      std::__cxx11::string::insert((ulong)output,(string *)(pcVar2 + -(long)this_00));
      std::__cxx11::string::~string((string *)&bStack_88);
      this_01 = &local_68;
    }
    else if (truncate == Head) {
      CleanTestOutput::anon_class_1_0_00000001::operator()
                (this_00,(char *)begin,(char *)(output->_M_string_length - length),
                 CONCAT44(in_register_0000000c,TVar3));
      std::__cxx11::string::erase((ulong)output,0);
      std::operator+(&bStack_88,&msg,"...");
      std::__cxx11::string::insert((ulong)output,(string *)0x0);
      this_01 = &bStack_88;
    }
    else {
      pcVar2 = CleanTestOutput::anon_class_1_0_00000001::operator()
                         (this_00,(char *)begin,(char *)length,CONCAT44(in_register_0000000c,TVar3))
      ;
      std::__cxx11::string::erase((ulong)output,(long)pcVar2 - (long)this_00);
      std::operator+(&bStack_88,"...",&msg);
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void cmCTestTestHandler::CleanTestOutput(std::string& output, size_t length,
                                         cmCTestTypes::TruncationMode truncate)
{
  if (!length || length >= output.size() ||
      output.find("CTEST_FULL_OUTPUT") != std::string::npos) {
    return;
  }

  // Advance n bytes in string delimited by begin/end but do not break in the
  // middle of a multi-byte UTF-8 encoding.
  auto utf8_advance = [](char const* const begin, char const* const end,
                         size_t n) -> const char* {
    char const* const stop = begin + n;
    char const* current = begin;
    while (current < stop) {
      unsigned int ch;
      if (const char* next = cm_utf8_decode_character(current, end, &ch)) {
        if (next > stop) {
          break;
        }
        current = next;
      } else // Bad byte will be handled by cmXMLWriter.
      {
        ++current;
      }
    }
    return current;
  };

  // Truncation message.
  const std::string msg =
    "\n[This part of the test output was removed since it "
    "exceeds the threshold of " +
    std::to_string(length) + " bytes.]\n";

  char const* const begin = output.c_str();
  char const* const end = begin + output.size();

  // Erase head, middle or tail of output.
  if (truncate == cmCTestTypes::TruncationMode::Head) {
    char const* current = utf8_advance(begin, end, output.size() - length);
    output.erase(0, current - begin);
    output.insert(0, msg + "...");
  } else if (truncate == cmCTestTypes::TruncationMode::Middle) {
    char const* current = utf8_advance(begin, end, length / 2);
    output.erase(current - begin, output.size() - length);
    output.insert(current - begin, "..." + msg + "...");
  } else { // default or "tail"
    char const* current = utf8_advance(begin, end, length);
    output.erase(current - begin);
    output += ("..." + msg);
  }
}